

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O1

OutputInfo * __thiscall cmGeneratorTarget::GetOutputInfo(cmGeneratorTarget *this,string *config)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  size_type sVar3;
  bool bVar4;
  TargetType targetType;
  iterator iVar5;
  cmake *this_00;
  string *psVar6;
  long *plVar7;
  size_type *psVar8;
  OutputInfo *pOVar9;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGeneratorTarget::OutputInfo>_>,_bool>
  pVar10;
  string msg;
  string config_upper;
  value_type entry;
  undefined1 local_150 [32];
  OutputInfo local_130;
  undefined1 local_d0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGeneratorTarget::OutputInfo>
  local_b0;
  
  bVar4 = cmTarget::IsImported(this->Target);
  if (bVar4) {
    return (OutputInfo *)0x0;
  }
  bVar4 = HaveWellDefinedOutputFiles(this);
  if (!bVar4) {
    psVar6 = cmTarget::GetName_abi_cxx11_(this->Target);
    pcVar2 = (psVar6->_M_dataplus)._M_p;
    sVar3 = psVar6->_M_string_length;
    targetType = cmTarget::GetType(this->Target);
    psVar6 = cmState::GetTargetTypeName_abi_cxx11_(targetType);
    local_b0.first._M_dataplus._M_p = (pointer)0x2c;
    local_b0.first._M_string_length = 0x7d7787;
    local_b0.second.OutDir._M_dataplus._M_p = (pointer)0x10;
    local_b0.second.OutDir._M_string_length = 0x7d6918;
    local_b0.second.OutDir.field_2._8_8_ = (psVar6->_M_dataplus)._M_p;
    local_b0.second.OutDir.field_2._M_allocated_capacity = psVar6->_M_string_length;
    views._M_len = 4;
    views._M_array = (iterator)&local_b0;
    local_b0.first.field_2._M_allocated_capacity = sVar3;
    local_b0.first.field_2._8_8_ = pcVar2;
    cmCatViews_abi_cxx11_(&local_130.OutDir,views);
    cmLocalGenerator::IssueMessage(this->LocalGenerator,INTERNAL_ERROR,&local_130.OutDir);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_130.OutDir._M_dataplus._M_p == &local_130.OutDir.field_2) {
      return (OutputInfo *)0x0;
    }
    operator_delete(local_130.OutDir._M_dataplus._M_p,
                    CONCAT71(local_130.OutDir.field_2._M_allocated_capacity._1_7_,
                             local_130.OutDir.field_2._M_local_buf[0]) + 1);
    return (OutputInfo *)0x0;
  }
  local_d0._0_8_ = &local_c0;
  local_d0._8_8_ = 0;
  local_c0._M_local_buf[0] = '\0';
  if (config->_M_string_length != 0) {
    cmsys::SystemTools::UpperCase(&local_b0.first,config);
    std::__cxx11::string::operator=((string *)local_d0,(string *)&local_b0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0.first._M_dataplus._M_p != &local_b0.first.field_2) {
      operator_delete(local_b0.first._M_dataplus._M_p,
                      local_b0.first.field_2._M_allocated_capacity + 1);
    }
  }
  iVar5 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGeneratorTarget::OutputInfo>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGeneratorTarget::OutputInfo>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGeneratorTarget::OutputInfo>_>_>
          ::find(&(this->OutputInfoMap)._M_t,(key_type *)local_d0);
  if ((_Rb_tree_header *)iVar5._M_node == &(this->OutputInfoMap)._M_t._M_impl.super__Rb_tree_header)
  {
    local_130.OutDir._M_dataplus._M_p = (pointer)&local_130.OutDir.field_2;
    local_130.OutDir._M_string_length = 0;
    local_130.OutDir.field_2._M_local_buf[0] = '\0';
    local_130.ImpDir._M_dataplus._M_p = (pointer)&local_130.ImpDir.field_2;
    local_130.ImpDir._M_string_length = 0;
    local_130.ImpDir.field_2._M_local_buf[0] = '\0';
    local_130.PdbDir._M_dataplus._M_p = (pointer)&local_130.PdbDir.field_2;
    local_130.PdbDir._M_string_length = 0;
    local_130.PdbDir.field_2._M_local_buf[0] = '\0';
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGeneratorTarget::OutputInfo>
    ::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_cmGeneratorTarget::OutputInfo_&,_true>
              (&local_b0,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d0,
               &local_130);
    pVar10 = std::
             _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cmGeneratorTarget::OutputInfo>,std::_Select1st<std::pair<std::__cxx11::string_const,cmGeneratorTarget::OutputInfo>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmGeneratorTarget::OutputInfo>>>
             ::
             _M_emplace_unique<std::pair<std::__cxx11::string_const,cmGeneratorTarget::OutputInfo>&>
                       ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cmGeneratorTarget::OutputInfo>,std::_Select1st<std::pair<std::__cxx11::string_const,cmGeneratorTarget::OutputInfo>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmGeneratorTarget::OutputInfo>>>
                         *)&this->OutputInfoMap,&local_b0);
    iVar5._M_node = (_Base_ptr)pVar10.first._M_node;
    ComputeOutputDir(this,config,RuntimeBinaryArtifact,&local_130.OutDir);
    ComputeOutputDir(this,config,ImportLibraryArtifact,&local_130.ImpDir);
    local_150._16_4_ = 0x424450;
    local_150._8_8_ = (cmMakefile *)0x3;
    local_150._0_8_ = local_150 + 0x10;
    bVar4 = ComputePDBOutputDir(this,(string *)local_150,config,&local_130.PdbDir);
    if ((undefined1 *)local_150._0_8_ != local_150 + 0x10) {
      operator_delete((void *)local_150._0_8_,CONCAT44(local_150._20_4_,local_150._16_4_) + 1);
    }
    if (!bVar4) {
      std::__cxx11::string::_M_assign((string *)&local_130.PdbDir);
    }
    std::__cxx11::string::_M_assign((string *)(iVar5._M_node + 2));
    std::__cxx11::string::_M_assign((string *)(iVar5._M_node + 3));
    std::__cxx11::string::_M_assign((string *)(iVar5._M_node + 4));
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0.second.PdbDir._M_dataplus._M_p != &local_b0.second.PdbDir.field_2) {
      operator_delete(local_b0.second.PdbDir._M_dataplus._M_p,
                      local_b0.second.PdbDir.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0.second.ImpDir._M_dataplus._M_p != &local_b0.second.ImpDir.field_2) {
      operator_delete(local_b0.second.ImpDir._M_dataplus._M_p,
                      local_b0.second.ImpDir.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0.second.OutDir._M_dataplus._M_p != &local_b0.second.OutDir.field_2) {
      operator_delete(local_b0.second.OutDir._M_dataplus._M_p,
                      local_b0.second.OutDir.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0.first._M_dataplus._M_p != &local_b0.first.field_2) {
      operator_delete(local_b0.first._M_dataplus._M_p,
                      local_b0.first.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_130.PdbDir._M_dataplus._M_p != &local_130.PdbDir.field_2) {
      operator_delete(local_130.PdbDir._M_dataplus._M_p,
                      CONCAT71(local_130.PdbDir.field_2._M_allocated_capacity._1_7_,
                               local_130.PdbDir.field_2._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_130.ImpDir._M_dataplus._M_p != &local_130.ImpDir.field_2) {
      operator_delete(local_130.ImpDir._M_dataplus._M_p,
                      CONCAT71(local_130.ImpDir.field_2._M_allocated_capacity._1_7_,
                               local_130.ImpDir.field_2._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_130.OutDir._M_dataplus._M_p != &local_130.OutDir.field_2) {
      operator_delete(local_130.OutDir._M_dataplus._M_p,
                      CONCAT71(local_130.OutDir.field_2._M_allocated_capacity._1_7_,
                               local_130.OutDir.field_2._M_local_buf[0]) + 1);
    }
  }
  else if ((iVar5._M_node[3]._M_parent == (_Base_ptr)0x0 &&
            iVar5._M_node[2]._M_parent == (_Base_ptr)0x0) &&
          (iVar5._M_node[4]._M_parent == (_Base_ptr)0x0)) {
    this_00 = cmLocalGenerator::GetCMakeInstance(this->LocalGenerator);
    psVar6 = cmTarget::GetName_abi_cxx11_(this->Target);
    std::operator+(&local_130.OutDir,"Target \'",psVar6);
    plVar7 = (long *)std::__cxx11::string::append((char *)&local_130);
    paVar1 = &local_b0.first.field_2;
    psVar8 = (size_type *)(plVar7 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar7 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar8) {
      local_b0.first.field_2._M_allocated_capacity = *psVar8;
      local_b0.first.field_2._8_8_ = plVar7[3];
      local_b0.first._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_b0.first.field_2._M_allocated_capacity = *psVar8;
      local_b0.first._M_dataplus._M_p = (pointer)*plVar7;
    }
    local_b0.first._M_string_length = plVar7[1];
    *plVar7 = (long)psVar8;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    GetBacktrace((cmGeneratorTarget *)local_150);
    cmake::IssueMessage(this_00,FATAL_ERROR,&local_b0.first,(cmListFileBacktrace *)local_150);
    if ((cmMakefile *)local_150._8_8_ != (cmMakefile *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_150._8_8_);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0.first._M_dataplus._M_p != paVar1) {
      operator_delete(local_b0.first._M_dataplus._M_p,
                      local_b0.first.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_130.OutDir._M_dataplus._M_p != &local_130.OutDir.field_2) {
      operator_delete(local_130.OutDir._M_dataplus._M_p,
                      CONCAT71(local_130.OutDir.field_2._M_allocated_capacity._1_7_,
                               local_130.OutDir.field_2._M_local_buf[0]) + 1);
    }
    pOVar9 = (OutputInfo *)0x0;
    goto LAB_003f093b;
  }
  pOVar9 = (OutputInfo *)(iVar5._M_node + 2);
LAB_003f093b:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._0_8_ != &local_c0) {
    operator_delete((void *)local_d0._0_8_,
                    CONCAT71(local_c0._M_allocated_capacity._1_7_,local_c0._M_local_buf[0]) + 1);
    return pOVar9;
  }
  return pOVar9;
}

Assistant:

cmGeneratorTarget::OutputInfo const* cmGeneratorTarget::GetOutputInfo(
  const std::string& config) const
{
  // There is no output information for imported targets.
  if (this->IsImported()) {
    return nullptr;
  }

  // Only libraries and executables have well-defined output files.
  if (!this->HaveWellDefinedOutputFiles()) {
    std::string msg = cmStrCat("cmGeneratorTarget::GetOutputInfo called for ",
                               this->GetName(), " which has type ",
                               cmState::GetTargetTypeName(this->GetType()));
    this->LocalGenerator->IssueMessage(MessageType::INTERNAL_ERROR, msg);
    return nullptr;
  }

  // Lookup/compute/cache the output information for this configuration.
  std::string config_upper;
  if (!config.empty()) {
    config_upper = cmSystemTools::UpperCase(config);
  }
  auto i = this->OutputInfoMap.find(config_upper);
  if (i == this->OutputInfoMap.end()) {
    // Add empty info in map to detect potential recursion.
    OutputInfo info;
    OutputInfoMapType::value_type entry(config_upper, info);
    i = this->OutputInfoMap.insert(entry).first;

    // Compute output directories.
    this->ComputeOutputDir(config, cmStateEnums::RuntimeBinaryArtifact,
                           info.OutDir);
    this->ComputeOutputDir(config, cmStateEnums::ImportLibraryArtifact,
                           info.ImpDir);
    if (!this->ComputePDBOutputDir("PDB", config, info.PdbDir)) {
      info.PdbDir = info.OutDir;
    }

    // Now update the previously-prepared map entry.
    i->second = info;
  } else if (i->second.empty()) {
    // An empty map entry indicates we have been called recursively
    // from the above block.
    this->LocalGenerator->GetCMakeInstance()->IssueMessage(
      MessageType::FATAL_ERROR,
      "Target '" + this->GetName() + "' OUTPUT_DIRECTORY depends on itself.",
      this->GetBacktrace());
    return nullptr;
  }
  return &i->second;
}